

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

float ImGui::RoundScalarWithFormatT<float,float>(char *format,ImGuiDataType data_type,float v)

{
  char cVar1;
  double dVar2;
  char *pcVar3;
  size_t fmt_out_size;
  char cStack_79;
  char v_str [64];
  char fmt_sanitized [32];
  
  pcVar3 = ImParseFormatFindStart(format);
  if ((*pcVar3 == '%') && (pcVar3[1] != '%')) {
    SanitizeFormatString(pcVar3,fmt_sanitized,fmt_out_size);
    ImFormatString(v_str,0x40,fmt_sanitized,SUB84((double)v,0));
    pcVar3 = &cStack_79;
    do {
      cVar1 = pcVar3[1];
      pcVar3 = pcVar3 + 1;
    } while (cVar1 == ' ');
    if ((data_type & 0xfffffffeU) == 8) {
      dVar2 = atof(pcVar3);
      v = (float)dVar2;
    }
    else {
      v = 0.0;
      for (pcVar3 = pcVar3 + (ulong)(pcVar3[cVar1 == '-'] == '+') + (ulong)(cVar1 == '-');
          (byte)(*pcVar3 - 0x30U) < 10; pcVar3 = pcVar3 + 1) {
        v = v * 10.0 + (float)(int)(char)(*pcVar3 - 0x30U);
      }
      if (cVar1 == '-') {
        v = -v;
      }
    }
  }
  return v;
}

Assistant:

TYPE ImGui::RoundScalarWithFormatT(const char* format, ImGuiDataType data_type, TYPE v)
{
    const char* fmt_start = ImParseFormatFindStart(format);
    if (fmt_start[0] != '%' || fmt_start[1] == '%') // Don't apply if the value is not visible in the format string
        return v;

    // Sanitize format
    char fmt_sanitized[32];
    SanitizeFormatString(fmt_start, fmt_sanitized, IM_ARRAYSIZE(fmt_sanitized));
    fmt_start = fmt_sanitized;

    // Format value with our rounding, and read back
    char v_str[64];
    ImFormatString(v_str, IM_ARRAYSIZE(v_str), fmt_start, v);
    const char* p = v_str;
    while (*p == ' ')
        p++;
    if (data_type == ImGuiDataType_Float || data_type == ImGuiDataType_Double)
        v = (TYPE)ImAtof(p);
    else
        ImAtoi(p, (SIGNEDTYPE*)&v);
    return v;
}